

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

MOJOSHADER_parseData * copyparsedata(MOJOSHADER_parseData *src,MOJOSHADER_malloc m,void *d)

{
  int iVar1;
  MOJOSHADER_uniform *pMVar2;
  MOJOSHADER_sampler *pMVar3;
  MOJOSHADER_attribute *pMVar4;
  MOJOSHADER_parseData *__s;
  MOJOSHADER_error *pMVar5;
  size_t sVar6;
  char *pcVar7;
  MOJOSHADER_uniform *pMVar8;
  MOJOSHADER_constant *__dest;
  MOJOSHADER_sampler *pMVar9;
  MOJOSHADER_attribute *pMVar10;
  MOJOSHADER_swizzle *__dest_00;
  MOJOSHADER_symbol *__s_00;
  MOJOSHADER_preshader *pMVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  
  __s = (MOJOSHADER_parseData *)(*m)(0xd0,d);
  memset(__s,0,0xd0);
  __s->malloc = src->malloc;
  __s->free = src->free;
  __s->malloc_data = src->malloc_data;
  uVar14 = src->error_count * 0x18;
  __s->error_count = src->error_count;
  pMVar5 = (MOJOSHADER_error *)(*m)(uVar14,d);
  __s->errors = pMVar5;
  memset(pMVar5,0,(ulong)uVar14);
  if (0 < __s->error_count) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      sVar6 = strlen(*(char **)((long)&src->errors->error + lVar13));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->errors->error + lVar13));
      *(char **)((long)&__s->errors->error + lVar13) = pcVar7;
      sVar6 = strlen(*(char **)((long)&src->errors->filename + lVar13));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->errors->filename + lVar13));
      pMVar5 = __s->errors;
      *(char **)((long)&pMVar5->filename + lVar13) = pcVar7;
      *(undefined4 *)((long)&pMVar5->error_position + lVar13) =
           *(undefined4 *)((long)&src->errors->error_position + lVar13);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar12 < __s->error_count);
  }
  __s->profile = src->profile;
  __s->output_len = src->output_len;
  pcVar7 = (char *)(*m)(src->output_len,d);
  memcpy(pcVar7,src->output,(long)src->output_len);
  __s->output = pcVar7;
  __s->instruction_count = src->instruction_count;
  __s->shader_type = src->shader_type;
  __s->major_ver = src->major_ver;
  __s->minor_ver = src->minor_ver;
  uVar14 = src->uniform_count * 0x18;
  __s->uniform_count = src->uniform_count;
  pMVar8 = (MOJOSHADER_uniform *)(*m)(uVar14,d);
  __s->uniforms = pMVar8;
  memset(pMVar8,0,(ulong)uVar14);
  if (0 < __s->uniform_count) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pMVar8 = src->uniforms;
      pMVar2 = __s->uniforms;
      *(undefined4 *)((long)&pMVar2->type + lVar12) = *(undefined4 *)((long)&pMVar8->type + lVar12);
      *(undefined4 *)((long)&pMVar2->index + lVar12) =
           *(undefined4 *)((long)&pMVar8->index + lVar12);
      *(undefined4 *)((long)&pMVar2->array_count + lVar12) =
           *(undefined4 *)((long)&pMVar8->array_count + lVar12);
      *(undefined4 *)((long)&pMVar2->constant + lVar12) =
           *(undefined4 *)((long)&pMVar8->constant + lVar12);
      sVar6 = strlen(*(char **)((long)&pMVar8->name + lVar12));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->uniforms->name + lVar12));
      *(char **)((long)&__s->uniforms->name + lVar12) = pcVar7;
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar13 < __s->uniform_count);
  }
  uVar14 = src->constant_count * 0x18;
  __s->constant_count = src->constant_count;
  __dest = (MOJOSHADER_constant *)(*m)(uVar14,d);
  __s->constants = __dest;
  memcpy(__dest,src->constants,(ulong)uVar14);
  uVar14 = src->sampler_count * 0x18;
  __s->sampler_count = src->sampler_count;
  pMVar9 = (MOJOSHADER_sampler *)(*m)(uVar14,d);
  __s->samplers = pMVar9;
  memset(pMVar9,0,(ulong)uVar14);
  if (0 < __s->sampler_count) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pMVar9 = src->samplers;
      pMVar3 = __s->samplers;
      *(undefined4 *)((long)&pMVar3->type + lVar12) = *(undefined4 *)((long)&pMVar9->type + lVar12);
      *(undefined4 *)((long)&pMVar3->index + lVar12) =
           *(undefined4 *)((long)&pMVar9->index + lVar12);
      sVar6 = strlen(*(char **)((long)&pMVar9->name + lVar12));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->samplers->name + lVar12));
      pMVar9 = __s->samplers;
      *(char **)((long)&pMVar9->name + lVar12) = pcVar7;
      *(undefined4 *)((long)&pMVar9->texbem + lVar12) =
           *(undefined4 *)((long)&src->samplers->texbem + lVar12);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar13 < __s->sampler_count);
  }
  iVar1 = src->attribute_count;
  __s->attribute_count = iVar1;
  uVar14 = iVar1 << 4;
  pMVar10 = (MOJOSHADER_attribute *)(*m)(uVar14,d);
  __s->attributes = pMVar10;
  memset(pMVar10,0,(ulong)uVar14);
  if (0 < __s->attribute_count) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pMVar10 = src->attributes;
      pMVar4 = __s->attributes;
      *(undefined4 *)((long)&pMVar4->usage + lVar12) =
           *(undefined4 *)((long)&pMVar10->usage + lVar12);
      *(undefined4 *)((long)&pMVar4->index + lVar12) =
           *(undefined4 *)((long)&pMVar10->index + lVar12);
      sVar6 = strlen(*(char **)((long)&pMVar10->name + lVar12));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->attributes->name + lVar12));
      *(char **)((long)&__s->attributes->name + lVar12) = pcVar7;
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar13 < __s->attribute_count);
  }
  iVar1 = src->output_count;
  __s->output_count = iVar1;
  uVar14 = iVar1 << 4;
  pMVar10 = (MOJOSHADER_attribute *)(*m)(uVar14,d);
  __s->outputs = pMVar10;
  memset(pMVar10,0,(ulong)uVar14);
  if (0 < __s->output_count) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pMVar10 = src->outputs;
      pMVar4 = __s->outputs;
      *(undefined4 *)((long)&pMVar4->usage + lVar12) =
           *(undefined4 *)((long)&pMVar10->usage + lVar12);
      *(undefined4 *)((long)&pMVar4->index + lVar12) =
           *(undefined4 *)((long)&pMVar10->index + lVar12);
      sVar6 = strlen(*(char **)((long)&pMVar10->name + lVar12));
      pcVar7 = (char *)(*m)((int)sVar6 + 1,d);
      strcpy(pcVar7,*(char **)((long)&src->outputs->name + lVar12));
      *(char **)((long)&__s->outputs->name + lVar12) = pcVar7;
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar13 < __s->output_count);
  }
  uVar14 = src->swizzle_count * 0xc;
  __s->swizzle_count = src->swizzle_count;
  __dest_00 = (MOJOSHADER_swizzle *)(*m)(uVar14,d);
  __s->swizzles = __dest_00;
  memcpy(__dest_00,src->swizzles,(ulong)uVar14);
  uVar14 = src->symbol_count * 0x38;
  __s->symbol_count = src->symbol_count;
  __s_00 = (MOJOSHADER_symbol *)(*m)(uVar14,d);
  __s->symbols = __s_00;
  memset(__s_00,0,(ulong)uVar14);
  if (0 < __s->symbol_count) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      copysymbol((MOJOSHADER_symbol *)((long)&__s->symbols->name + lVar12),
                 (MOJOSHADER_symbol *)((long)&src->symbols->name + lVar12),m,d);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x38;
    } while (lVar13 < __s->symbol_count);
  }
  if (src->preshader != (MOJOSHADER_preshader *)0x0) {
    pMVar11 = copypreshader(src->preshader,m,d);
    __s->preshader = pMVar11;
  }
  return __s;
}

Assistant:

MOJOSHADER_parseData *copyparsedata(const MOJOSHADER_parseData *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;
    MOJOSHADER_parseData *retval;

    retval = (MOJOSHADER_parseData *) m(sizeof (MOJOSHADER_parseData), d);
    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    /* Copy malloc/free */
    retval->malloc = src->malloc;
    retval->free = src->free;
    retval->malloc_data = src->malloc_data;

    // !!! FIXME: Out of memory check!
    #define COPY_STRING(location) \
        siz = strlen(src->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        strcpy(stringcopy, src->location); \
        retval->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * src->error_count;
    retval->error_count = src->error_count;
    retval->errors = (MOJOSHADER_error *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->errors, '\0', siz);
    for (i = 0; i < retval->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        retval->errors[i].error_position = src->errors[i].error_position;
    } // for

    /* Copy profile string constant */
    retval->profile = src->profile;

    /* Copy shader output */
    retval->output_len = src->output_len;
    stringcopy = (char *) m(src->output_len, d);
    memcpy(stringcopy, src->output, src->output_len);
    retval->output = stringcopy;

    /* Copy miscellaneous shader info */
    retval->instruction_count = src->instruction_count;
    retval->shader_type = src->shader_type;
    retval->major_ver = src->major_ver;
    retval->minor_ver = src->minor_ver;

    /* Copy uniforms */
    siz = sizeof (MOJOSHADER_uniform) * src->uniform_count;
    retval->uniform_count = src->uniform_count;
    retval->uniforms = (MOJOSHADER_uniform *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->uniforms, '\0', siz);
    for (i = 0; i < retval->uniform_count; i++)
    {
        retval->uniforms[i].type = src->uniforms[i].type;
        retval->uniforms[i].index = src->uniforms[i].index;
        retval->uniforms[i].array_count = src->uniforms[i].array_count;
        retval->uniforms[i].constant = src->uniforms[i].constant;
        COPY_STRING(uniforms[i].name)
    } // for

    /* Copy constants */
    siz = sizeof (MOJOSHADER_constant) * src->constant_count;
    retval->constant_count = src->constant_count;
    retval->constants = (MOJOSHADER_constant *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->constants, src->constants, siz);

    /* Copy samplers */
    siz = sizeof (MOJOSHADER_sampler) * src->sampler_count;
    retval->sampler_count = src->sampler_count;
    retval->samplers = (MOJOSHADER_sampler *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->samplers, '\0', siz);
    for (i = 0; i < retval->sampler_count; i++)
    {
        retval->samplers[i].type = src->samplers[i].type;
        retval->samplers[i].index = src->samplers[i].index;
        COPY_STRING(samplers[i].name)
        retval->samplers[i].texbem = src->samplers[i].texbem;
    } // for

    /* Copy attributes */
    siz = sizeof (MOJOSHADER_attribute) * src->attribute_count;
    retval->attribute_count = src->attribute_count;
    retval->attributes = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->attributes, '\0', siz);
    for (i = 0; i < retval->attribute_count; i++)
    {
        retval->attributes[i].usage = src->attributes[i].usage;
        retval->attributes[i].index = src->attributes[i].index;
        COPY_STRING(attributes[i].name)
    } // for

    /* Copy outputs */
    siz = sizeof (MOJOSHADER_attribute) * src->output_count;
    retval->output_count = src->output_count;
    retval->outputs = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->outputs, '\0', siz);
    for (i = 0; i < retval->output_count; i++)
    {
        retval->outputs[i].usage = src->outputs[i].usage;
        retval->outputs[i].index = src->outputs[i].index;
        COPY_STRING(outputs[i].name)
    } // for

    #undef COPY_STRING

    /* Copy swizzles */
    siz = sizeof (MOJOSHADER_swizzle) * src->swizzle_count;
    retval->swizzle_count = src->swizzle_count;
    retval->swizzles = (MOJOSHADER_swizzle *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->swizzles, src->swizzles, siz);

    /* Copy symbols */
    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);
    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    /* Copy preshader */
    if (src->preshader != NULL)
        retval->preshader = copypreshader(src->preshader, m, d);

    return retval;
}